

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O0

void __thiscall OpenMesh::ArrayKernel::~ArrayKernel(ArrayKernel *this)

{
  ArrayKernel *this_local;
  
  (this->super_BaseKernel)._vptr_BaseKernel = (_func_int **)&PTR__ArrayKernel_003dea50;
  clear(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->face_bit_masks_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->vertex_bit_masks_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->edge_bit_masks_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->halfedge_bit_masks_);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::~vector
            (&this->faces_);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::~vector
            (&this->edges_);
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::~vector
            (&this->vertices_);
  BaseKernel::~BaseKernel(&this->super_BaseKernel);
  return;
}

Assistant:

ArrayKernel::~ArrayKernel()
{
  clear();
}